

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

Entry * __thiscall
Ptex::v2_2::PtexReader::MetaData::newEntry
          (MetaData *this,uint8_t keysize,char *key,uint8_t datatype,uint32_t datasize,
          size_t *metaDataMemUsed)

{
  pointer ppVar1;
  size_type sVar2;
  char *pcVar3;
  byte in_CL;
  char *in_RDX;
  byte in_SIL;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>
  *in_RDI;
  uint32_t in_R8D;
  long *in_R9;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_Entry>_>::value,_pair<iterator,_bool>_>
  _Var4;
  uint32_t index;
  bool newentry;
  Entry *e;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>_>,_bool>
  result;
  Entry *in_stack_fffffffffffffeb0;
  Entry *this_00;
  uint32_t local_120;
  Entry local_100;
  allocator local_b1;
  string local_b0 [120];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>
  *local_38;
  byte local_30;
  long *local_28;
  uint32_t local_20;
  byte local_19;
  byte local_9;
  
  this_00 = (Entry *)&(in_RDI->first).field_2;
  local_28 = in_R9;
  local_20 = in_R8D;
  local_19 = in_CL;
  local_9 = in_SIL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,in_RDX,(ulong)in_SIL,&local_b1);
  Entry::Entry(&local_100);
  std::make_pair<std::__cxx11::string,Ptex::v2_2::PtexReader::MetaData::Entry>
            (&in_RDI->first,in_stack_fffffffffffffeb0);
  _Var4 = std::
          map<std::__cxx11::string,Ptex::v2_2::PtexReader::MetaData::Entry,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Ptex::v2_2::PtexReader::MetaData::Entry>>>
          ::insert<std::pair<std::__cxx11::string,Ptex::v2_2::PtexReader::MetaData::Entry>>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>_>_>
                      *)this_00,in_RDI);
  local_38 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>
              *)_Var4.first._M_node;
  local_30 = _Var4.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>
  ::~pair(local_38);
  Entry::~Entry((Entry *)0x9195d0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>_>
                         *)0x9195f7);
  if ((local_30 & 1) == 0) {
    local_120 = (ppVar1->second).index;
    Entry::clear(this_00);
  }
  else {
    sVar2 = std::
            vector<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
            ::size((vector<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                    *)&(in_RDI->second).lmdData);
    local_120 = (uint32_t)sVar2;
    std::
    vector<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
    ::push_back((vector<Ptex::v2_2::PtexReader::MetaData::Entry_*,_std::allocator<Ptex::v2_2::PtexReader::MetaData::Entry_*>_>
                 *)this_00,(value_type *)in_RDI);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Ptex::v2_2::PtexReader::MetaData::Entry>_>
                *)0x9196f9);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  (ppVar1->second).key = pcVar3;
  (ppVar1->second).type = (uint)local_19;
  (ppVar1->second).datasize = local_20;
  (ppVar1->second).index = local_120;
  *local_28 = (ulong)local_9 + 0x59 + *local_28;
  return &ppVar1->second;
}

Assistant:

Entry* newEntry(uint8_t keysize, const char* key, uint8_t datatype, uint32_t datasize, size_t& metaDataMemUsed)
	{
	    std::pair<MetaMap::iterator,bool> result =
		_map.insert(std::make_pair(std::string(key, keysize), Entry()));
	    Entry* e = &result.first->second;
	    bool newentry = result.second;
	    uint32_t index = 0;
	    if (newentry) {
		index = uint32_t(_entries.size());
		_entries.push_back(e);
	    }
	    else {
		index = e->index;
		e->clear();
	    }
	    e->key = result.first->first.c_str();
	    e->type = MetaDataType(datatype);
	    e->datasize = datasize;
	    e->index = index;
            metaDataMemUsed += sizeof(std::string) + keysize + 1 + sizeof(Entry);
            return e;
        }